

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall
cmGeneratedFileStreamBase::cmGeneratedFileStreamBase(cmGeneratedFileStreamBase *this,char *name)

{
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->TempName)._M_dataplus._M_p = (pointer)&(this->TempName).field_2;
  (this->TempName)._M_string_length = 0;
  (this->TempName).field_2._M_local_buf[0] = '\0';
  this->CopyIfDifferent = false;
  this->Okay = false;
  this->Compress = false;
  this->CompressExtraExtension = true;
  Open(this,name);
  return;
}

Assistant:

cmGeneratedFileStreamBase::cmGeneratedFileStreamBase(const char* name):
  Name(),
  TempName(),
  CopyIfDifferent(false),
  Okay(false),
  Compress(false),
  CompressExtraExtension(true)
{
  this->Open(name);
}